

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::find_handler
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *name)

{
  bool bVar1;
  options_container *__cont;
  const_iterator __first;
  pstore *this;
  option **value;
  _Self local_30;
  _List_const_iterator<pstore::command_line::option_*> it;
  const_iterator end;
  options_container *all_options;
  string *name_local;
  
  __cont = option::all_abi_cxx11_();
  it._M_node = (_List_node_base *)
               std::
               end<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                         (__cont);
  __first = std::
            begin<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                      (__cont);
  local_30._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::find_handler(std::__cxx11::string_const&)::__0>
                 (__first._M_node,it,(anon_class_8_1_898f2789_for__M_pred)name);
  bVar1 = std::operator!=(&local_30,&it);
  if (bVar1) {
    this = (pstore *)std::_List_const_iterator<pstore::command_line::option_*>::operator*(&local_30)
    ;
    just<pstore::command_line::option*const&>(__return_storage_ptr__,this,value);
  }
  else {
    nothing<pstore::command_line::option*>();
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<option *> find_handler (std::string const & name) {
                    auto const & all_options = option::all ();
                    auto const end = std::end (all_options);
                    auto const it =
                        std::find_if (std::begin (all_options), end, [&name] (option * const opt) {
                            return opt->name () == name;
                        });
                    return it != end ? just (*it) : nothing<option *> ();
                }